

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

int Mvc_CoverGetCubeSize(Mvc_Cube_t *pCube)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  Mvc_CubeWord_t *pMVar4;
  
  uVar3 = ((*(uint *)&pCube->field_0x8 & 0xffffff) * 0x20 -
          (*(uint *)&pCube->field_0x8 >> 0x18 & 0x3f)) + 0x20;
  lVar2 = (long)(int)(((int)((ulong)(long)(int)uVar3 >> 3) + 1) - (uint)((uVar3 & 7) == 0));
  if (0 < lVar2) {
    pMVar4 = pCube->pData;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + bit_count[(byte)*pMVar4];
      pMVar4 = (Mvc_CubeWord_t *)((long)pMVar4 + 1);
    } while (pMVar4 < (byte *)((long)pCube->pData + lVar2));
    return iVar1;
  }
  return 0;
}

Assistant:

int Mvc_CoverGetCubeSize( Mvc_Cube_t * pCube )
{
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nOnes, nBytes, nBits;
    // get the number of unsigned chars in the cube's bit strings
    nBits = (pCube->iLast + 1) * sizeof(Mvc_CubeWord_t) * 8 - pCube->nUnused;
    nBytes = nBits / (8 * sizeof(unsigned char)) + (int)(nBits % (8 * sizeof(unsigned char)) > 0);
    // clean the counter of ones
    nOnes = 0;
    // set the starting and stopping positions
    pByteStart = (unsigned char *)pCube->pData;
    pByteStop  = pByteStart + nBytes;
    // iterate through the positions
    for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
        nOnes += bit_count[*pByte];
    return nOnes;
}